

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs_sampling_three.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  ostream *poVar2;
  double dVar3;
  double local_98;
  double r2;
  double r1;
  double mu;
  double sigma;
  double dStack_70;
  int iter;
  double z;
  double y;
  double x;
  double A [3] [3];
  
  A[2][2]._4_4_ = 0;
  x = 1.0;
  A[1][0] = 2.0;
  A[2][1] = 2.0;
  A[0][0] = 1.0;
  A[0][1] = 1.0;
  A[1][1] = 1.0;
  A[0][2] = 1.0;
  A[1][2] = 1.0;
  A[2][0] = 1.0;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  y = 0.0;
  z = 0.0;
  dStack_70 = 0.0;
  for (sigma._4_4_ = 0; sigma._4_4_ < 10000; sigma._4_4_ = sigma._4_4_ + 1) {
    dVar3 = sqrt(x);
    mu = 1.0 / dVar3;
    r1 = (-A[0][0] / x) * z + -((A[0][1] / x) * dStack_70);
    BoxMuller(&r2,&local_98);
    y = mu * r2 + r1;
    dVar3 = sqrt(A[1][0]);
    mu = 1.0 / dVar3;
    r1 = (-A[0][2] / A[1][0]) * y + -((A[1][1] / A[1][0]) * dStack_70);
    BoxMuller(&r2,&local_98);
    z = mu * r2 + r1;
    dVar3 = sqrt(A[2][1]);
    mu = 1.0 / dVar3;
    r1 = (-A[1][2] / A[2][1]) * y + -((A[2][0] / A[2][1]) * z);
    BoxMuller(&r2,&local_98);
    dStack_70 = mu * r2 + r1;
    if ((sigma._4_4_ + 1) % 10 == 0) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,y);
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,z);
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return 0;
}

Assistant:

int main() {
    double A[3][3];
    A[0][0] = 1e0, A[1][1] = 2e0, A[2][2] = 2e0;
    A[0][1] = 1e0, A[0][2] = 1e0, A[1][2] = 1e0;
    A[1][0] = A[0][1], A[2][0] = A[0][2], A[2][1] = A[1][2];

    srand((unsigned) time(nullptr));
    double x = 0e0, y = 0e0, z = 0e0;
    for (int iter = 0; iter < niter; iter++) {
        double sigma, mu;
        double r1, r2;

        // x更新
        sigma = 1e0 / sqrt(A[0][0]);
        mu = -A[0][1] / A[0][0] * y - A[0][2] / A[0][0] * z;
        BoxMuller(r1, r2);
        x = sigma * r1 + mu;

        // y更新
        sigma = 1e0 / sqrt(A[1][1]);
        mu = -A[1][0] / A[1][1] * x - A[1][2] / A[1][1] * z;
        BoxMuller(r1, r2);
        y = sigma * r1 + mu;

        // x更新
        sigma = 1e0 / sqrt(A[2][2]);
        mu = -A[2][0] / A[2][2] * x - A[2][1] / A[2][2] * y;
        BoxMuller(r1, r2);
        z = sigma * r1 + mu;

        if ((iter + 1) % 10 == 0) {
            std::cout << x << "  " << y << "  " << x << std::endl;
        }
    }
    return 0;
}